

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::Matchers::StringMatcherBase::StringMatcherBase
          (StringMatcherBase *this,StringRef operation,CasedString *comparator)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  CasedString *in_RDI;
  CasedString *in_stack_ffffffffffffffd0;
  
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_ffffffffffffffd0);
  *(undefined ***)in_RDI = &PTR__StringMatcherBase_002a65a8;
  CasedString::CasedString(in_stack_ffffffffffffffd0,in_RDI);
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  *(undefined8 *)&in_RDI[2].m_str = in_RDX;
  return;
}

Assistant:

StringMatcherBase::StringMatcherBase( StringRef operation, CasedString const& comparator )
    : m_comparator( comparator ),
      m_operation( operation ) {
    }